

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::DebugNodeTable(ImGuiTable *table)

{
  ImGuiTableSettings *settings;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImGuiTableColumn *pIVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  ImVec4 *col;
  ImDrawList *pIVar14;
  long lVar15;
  char *pcVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  ulong uVar21;
  float fVar22;
  double dVar23;
  ImRect r;
  char buf [512];
  ImVec2 local_288;
  ImVec2 local_280;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  float local_264;
  ImGuiTable *local_260;
  double local_258;
  double local_250;
  char *local_248;
  ImVec2 local_240;
  char local_238 [520];
  
  iVar12 = table->LastFrameActive;
  iVar10 = GetFrameCount();
  pcVar13 = " *Inactive*";
  if (iVar10 + -2 <= iVar12) {
    pcVar13 = "";
  }
  ImFormatString(local_238,0x200,"Table 0x%08X (%d columns, in \'%s\')%s",(ulong)table->ID,
                 (ulong)(uint)table->ColumnsCount,table->OuterWindow->Name,pcVar13);
  if (iVar12 < iVar10 + -2) {
    col = GetStyleColorVec4(1);
    PushStyleColor(0,col);
    bVar7 = TreeNode(table,"%s",local_238);
    PopStyleColor(1);
  }
  else {
    bVar7 = TreeNode(table,"%s",local_238);
  }
  bVar8 = IsItemHovered(0);
  if (bVar8) {
    pIVar14 = GetForegroundDrawList();
    ImDrawList::AddRect(pIVar14,&(table->OuterRect).Min,&(table->OuterRect).Max,0xff00ffff,0.0,0,1.0
                       );
  }
  bVar8 = IsItemVisible();
  if ((bVar8) && (table->HoveredColumnBody != -1)) {
    pIVar14 = GetForegroundDrawList();
    local_288 = GetItemRectMin();
    local_240 = GetItemRectMax();
    ImDrawList::AddRect(pIVar14,&local_288,&local_240,0xff00ffff,0.0,0,1.0);
  }
  if (bVar7 != false) {
    if (0 < table->InstanceCurrent) {
      Text("** %d instances of same table! Some data below will refer to last instance.",
           (ulong)((ushort)table->InstanceCurrent + 1));
    }
    bVar7 = SmallButton("Clear settings");
    fVar22 = (table->OuterRect).Min.x;
    fVar1 = (table->OuterRect).Min.y;
    uVar11 = (table->Flags & 0xe000U) - 0x2000;
    if (uVar11 < 0x8000) {
      pcVar13 = &DAT_0025b62c + *(int *)(&DAT_0025b62c + (uVar11 >> 0xb));
    }
    else {
      pcVar13 = "N/A";
    }
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: \'%s\'",(double)fVar22,
               (double)fVar1,(double)((table->OuterRect).Max.x - fVar22),
               (double)((table->OuterRect).Max.y - fVar1),pcVar13);
    fVar22 = table->InnerWidth;
    pcVar13 = " (auto)";
    if (fVar22 != 0.0) {
      pcVar13 = "";
    }
    if (NAN(fVar22)) {
      pcVar13 = "";
    }
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s",
               (double)table->ColumnsGivenWidth,(double)table->ColumnsAutoFitWidth,(double)fVar22,
               pcVar13);
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f",
               (double)table->CellPaddingX,(double)table->CellSpacingX1,(double)table->CellSpacingX2
              );
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d",
               (ulong)(uint)(int)table->HoveredColumnBody,
               (ulong)(uint)(int)table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d",
               (ulong)(uint)(int)table->ResizedColumn,(ulong)(uint)(int)table->ReorderColumn,
               (ulong)(uint)(int)table->HeldHeaderColumn);
    iVar12 = table->ColumnsCount;
    if (0 < (long)iVar12) {
      pIVar6 = (table->Columns).Data;
      lVar17 = 0;
      fVar22 = 0.0;
      do {
        if ((*(byte *)((long)&pIVar6->Flags + lVar17) & 8) != 0) {
          fVar22 = fVar22 + *(float *)((long)&pIVar6->StretchWeight + lVar17);
        }
        lVar17 = lVar17 + 0x68;
      } while ((long)iVar12 * 0x68 - lVar17 != 0);
      if (0 < iVar12) {
        lVar17 = 0x65;
        uVar21 = 0;
        local_264 = fVar22;
        local_260 = table;
        do {
          pIVar6 = (table->Columns).Data;
          if ((table->IsLayoutLocked != false) ||
             (local_248 = "", (long)uVar21 < (long)table->DeclColumnsCount)) {
            lVar15 = (long)*(short *)((long)pIVar6 + lVar17 + -0x15);
            local_248 = "";
            if (lVar15 != -1) {
              local_248 = (table->ColumnsNames).Buf.Data + lVar15;
            }
          }
          fVar22 = *(float *)((long)pIVar6 + lVar17 + -0x5d);
          fVar1 = (table->WorkRect).Min.x;
          local_250 = (double)(fVar22 - fVar1);
          fVar2 = *(float *)((long)pIVar6 + lVar17 + -0x59);
          local_258 = (double)(fVar2 - fVar1);
          pcVar13 = "";
          if ((long)uVar21 < (long)table->FreezeColumnsRequest) {
            pcVar13 = " (Frozen)";
          }
          fVar1 = *(float *)((long)pIVar6 + lVar17 + -0x4d);
          if (0.0 < fVar1) {
            dVar23 = (double)((fVar1 / local_264) * 100.0);
          }
          else {
            dVar23 = 0.0;
          }
          local_268 = (uint)*(char *)((long)pIVar6 + lVar17 + -0x13);
          local_26c = (uint)*(byte *)((long)pIVar6 + lVar17 + -0xb);
          local_270 = (uint)*(byte *)((long)pIVar6 + lVar17 + -8);
          local_274 = (uint)*(byte *)((long)pIVar6 + lVar17 + -7);
          local_278 = (uint)*(byte *)((long)pIVar6 + lVar17 + -6);
          fVar3 = *(float *)((long)pIVar6 + lVar17 + -0x45);
          fVar4 = *(float *)((long)pIVar6 + lVar17 + -0x3d);
          fVar5 = *(float *)((long)pIVar6 + lVar17 + -0x31);
          bVar9 = *(byte *)((long)&pIVar6->Flags + lVar17) & 3;
          pcVar20 = "";
          if (bVar9 == 2) {
            pcVar20 = " (Des)";
          }
          if (bVar9 == 1) {
            pcVar20 = " (Asc)";
          }
          uVar11 = *(uint *)((long)pIVar6 + lVar17 + -0x65);
          pcVar16 = "WidthStretch ";
          if ((uVar11 & 8) == 0) {
            pcVar16 = "";
          }
          pcVar18 = "WidthFixed ";
          if ((uVar11 & 0x10) == 0) {
            pcVar18 = "";
          }
          pcVar19 = "NoResize ";
          if ((uVar11 & 0x20) == 0) {
            pcVar19 = "";
          }
          ImFormatString(local_238,0x200,
                         "Column %d order %d \'%s\': offset %+.2f to %+.2f%s\nEnabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\nWidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\nMinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\nContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\nSort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s.."
                         ,local_250,local_258,(double)*(float *)((long)pIVar6 + lVar17 + -0x61),
                         (double)*(float *)((long)pIVar6 + lVar17 + -0x55),
                         (double)*(float *)((long)pIVar6 + lVar17 + -0x51),(double)fVar1,dVar23,
                         (double)fVar22,uVar21 & 0xffffffff,(ulong)local_268,local_248,pcVar13,
                         local_26c,local_270,local_274,local_278,
                         (uint)*(byte *)((long)pIVar6 + lVar17 + -5),
                         (uint)*(byte *)((long)pIVar6 + lVar17 + -0xd),
                         (uint)*(byte *)((long)pIVar6 + lVar17 + -0xc),(double)fVar2,
                         (double)(fVar2 - fVar22),(double)fVar3,(double)fVar4,
                         (double)(fVar4 - fVar3),
                         (double)(*(float *)((long)pIVar6 + lVar17 + -0x25) - fVar5),
                         (double)(*(float *)((long)pIVar6 + lVar17 + -0x21) - fVar5),
                         (double)(*(float *)((long)pIVar6 + lVar17 + -0x1d) - fVar5),
                         (double)(*(float *)((long)pIVar6 + lVar17 + -0x19) - fVar5),
                         (int)*(char *)((long)pIVar6 + lVar17 + -0xf),pcVar20,
                         *(undefined4 *)((long)pIVar6 + lVar17 + -0x35),uVar11,pcVar16,pcVar18,
                         pcVar19);
          Bullet();
          local_288.x = 0.0;
          local_288.y = 0.0;
          Selectable(local_238,false,0,&local_288);
          bVar8 = IsItemHovered(0);
          table = local_260;
          if (bVar8) {
            local_280.x = *(float *)((long)pIVar6 + lVar17 + -0x59);
            local_280.y = (local_260->OuterRect).Max.y;
            local_288.y = (local_260->OuterRect).Min.y;
            local_288.x = *(float *)((long)pIVar6 + lVar17 + -0x5d);
            pIVar14 = GetForegroundDrawList();
            ImDrawList::AddRect(pIVar14,&local_288,&local_280,0xff00ffff,0.0,0,1.0);
          }
          uVar21 = uVar21 + 1;
          iVar12 = table->ColumnsCount;
          lVar17 = lVar17 + 0x68;
        } while ((long)uVar21 < (long)iVar12);
      }
    }
    lVar17 = (long)table->SettingsOffset;
    if (lVar17 != -1) {
      pcVar13 = (GImGui->SettingsTables).Buf.Data;
      settings = (ImGuiTableSettings *)(pcVar13 + lVar17);
      if (pcVar13[lVar17 + 0xd] < iVar12) {
        settings->ID = 0;
      }
      else {
        DebugNodeTableSettings(settings);
      }
    }
    if (bVar7) {
      table->IsResetAllRequest = true;
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTable(ImGuiTable* table)
{
    char buf[512];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (table->LastFrameActive >= ImGui::GetFrameCount() - 2); // Note that fully clipped early out scrolling tables will appear as inactive here.
    ImFormatString(p, buf_end - p, "Table 0x%08X (%d columns, in '%s')%s", table->ID, table->ColumnsCount, table->OuterWindow->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(table, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered())
        GetForegroundDrawList()->AddRect(table->OuterRect.Min, table->OuterRect.Max, IM_COL32(255, 255, 0, 255));
    if (IsItemVisible() && table->HoveredColumnBody != -1)
        GetForegroundDrawList()->AddRect(GetItemRectMin(), GetItemRectMax(), IM_COL32(255, 255, 0, 255));
    if (!open)
        return;
    if (table->InstanceCurrent > 0)
        ImGui::Text("** %d instances of same table! Some data below will refer to last instance.", table->InstanceCurrent + 1);
    bool clear_settings = SmallButton("Clear settings");
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: '%s'", table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.GetWidth(), table->OuterRect.GetHeight(), DebugNodeTableGetSizingPolicyDesc(table->Flags));
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s", table->ColumnsGivenWidth, table->ColumnsAutoFitWidth, table->InnerWidth, table->InnerWidth == 0.0f ? " (auto)" : "");
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f", table->CellPaddingX, table->CellSpacingX1, table->CellSpacingX2, table->OuterPaddingX);
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d", table->HoveredColumnBody, table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d", table->ResizedColumn, table->ReorderColumn, table->HeldHeaderColumn);
    //BulletText("BgDrawChannels: %d/%d", 0, table->BgDrawChannelUnfrozen);
    float sum_weights = 0.0f;
    for (int n = 0; n < table->ColumnsCount; n++)
        if (table->Columns[n].Flags & ImGuiTableColumnFlags_WidthStretch)
            sum_weights += table->Columns[n].StretchWeight;
    for (int n = 0; n < table->ColumnsCount; n++)
    {
        ImGuiTableColumn* column = &table->Columns[n];
        const char* name = TableGetColumnName(table, n);
        ImFormatString(buf, IM_ARRAYSIZE(buf),
            "Column %d order %d '%s': offset %+.2f to %+.2f%s\n"
            "Enabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\n"
            "WidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\n"
            "MinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\n"
            "ContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\n"
            "Sort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s..",
            n, column->DisplayOrder, name, column->MinX - table->WorkRect.Min.x, column->MaxX - table->WorkRect.Min.x, (n < table->FreezeColumnsRequest) ? " (Frozen)" : "",
            column->IsEnabled, column->IsVisibleX, column->IsVisibleY, column->IsRequestOutput, column->IsSkipItems, column->DrawChannelFrozen, column->DrawChannelUnfrozen,
            column->WidthGiven, column->WidthRequest, column->WidthAuto, column->StretchWeight, column->StretchWeight > 0.0f ? (column->StretchWeight / sum_weights) * 100.0f : 0.0f,
            column->MinX, column->MaxX, column->MaxX - column->MinX, column->ClipRect.Min.x, column->ClipRect.Max.x, column->ClipRect.Max.x - column->ClipRect.Min.x,
            column->ContentMaxXFrozen - column->WorkMinX, column->ContentMaxXUnfrozen - column->WorkMinX, column->ContentMaxXHeadersUsed - column->WorkMinX, column->ContentMaxXHeadersIdeal - column->WorkMinX,
            column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? " (Asc)" : (column->SortDirection == ImGuiSortDirection_Descending) ? " (Des)" : "", column->UserID, column->Flags,
            (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? "WidthStretch " : "",
            (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? "WidthFixed " : "",
            (column->Flags & ImGuiTableColumnFlags_NoResize) ? "NoResize " : "");
        Bullet();
        Selectable(buf);
        if (IsItemHovered())
        {
            ImRect r(column->MinX, table->OuterRect.Min.y, column->MaxX, table->OuterRect.Max.y);
            GetForegroundDrawList()->AddRect(r.Min, r.Max, IM_COL32(255, 255, 0, 255));
        }
    }
    if (ImGuiTableSettings* settings = TableGetBoundSettings(table))
        DebugNodeTableSettings(settings);
    if (clear_settings)
        table->IsResetAllRequest = true;
    TreePop();
}